

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

LBBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vlinearBounds(LBBox3fa *__return_storage_ptr__,
               CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
               *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t primID,
               BBox1f *time_range)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  size_t itime;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float local_120;
  float local_11c;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  size_t local_d0;
  BBox<embree::Vec3fa> bi;
  anon_class_48_6_c0a27d27 local_a8;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_a8.scale = &local_11c;
  local_a8.r_scale0 = &local_120;
  local_a8.primID = &local_d0;
  fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.fnumTimeSegments;
  fVar11 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           super_Geometry.time_range.lower;
  fVar7 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper - fVar11;
  fVar9 = (time_range->lower - fVar11) / fVar7;
  fVar7 = (time_range->upper - fVar11) / fVar7;
  fVar11 = fVar1 * fVar9;
  fVar12 = fVar1 * fVar7;
  auVar2 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),9);
  auVar3 = vroundss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),10);
  auVar10 = vmaxss_avx(auVar2,ZEXT816(0));
  auVar8 = vminss_avx(auVar3,ZEXT416((uint)fVar1));
  fVar14 = auVar10._0_4_;
  fVar13 = auVar8._0_4_;
  iVar5 = (int)auVar2._0_4_;
  iVar6 = -1;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  iVar4 = (int)fVar1 + 1;
  if ((int)auVar3._0_4_ < (int)fVar1 + 1) {
    iVar4 = (int)auVar3._0_4_;
  }
  local_120 = r_scale0;
  local_11c = scale;
  local_d0 = primID;
  local_a8.ofs = ofs;
  local_a8.space = space;
  local_a8.this = this;
  linearBounds::anon_class_48_6_c0a27d27::operator()(&blower0,&local_a8,(long)(int)fVar14);
  linearBounds::anon_class_48_6_c0a27d27::operator()(&bupper1,&local_a8,(long)(int)fVar13);
  if (iVar4 - iVar6 == 1) {
    auVar10 = vmaxss_avx(ZEXT416((uint)(fVar11 - fVar14)),ZEXT816(0) << 0x40);
    auVar8 = vshufps_avx(auVar10,auVar10,0);
    auVar10 = ZEXT416((uint)(1.0 - auVar10._0_4_));
    auVar10 = vshufps_avx(auVar10,auVar10,0);
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] =
         auVar10._0_4_ * blower0.lower.field_0.m128[0] +
         auVar8._0_4_ * bupper1.lower.field_0.m128[0];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] =
         auVar10._4_4_ * blower0.lower.field_0.m128[1] +
         auVar8._4_4_ * bupper1.lower.field_0.m128[1];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] =
         auVar10._8_4_ * blower0.lower.field_0.m128[2] +
         auVar8._8_4_ * bupper1.lower.field_0.m128[2];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] =
         auVar10._12_4_ * blower0.lower.field_0.m128[3] +
         auVar8._12_4_ * bupper1.lower.field_0.m128[3];
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] =
         auVar8._0_4_ * bupper1.upper.field_0.m128[0] +
         auVar10._0_4_ * blower0.upper.field_0.m128[0];
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] =
         auVar8._4_4_ * bupper1.upper.field_0.m128[1] +
         auVar10._4_4_ * blower0.upper.field_0.m128[1];
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] =
         auVar8._8_4_ * bupper1.upper.field_0.m128[2] +
         auVar10._8_4_ * blower0.upper.field_0.m128[2];
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] =
         auVar8._12_4_ * bupper1.upper.field_0.m128[3] +
         auVar10._12_4_ * blower0.upper.field_0.m128[3];
    auVar10 = vmaxss_avx(ZEXT416((uint)(fVar13 - fVar12)),ZEXT816(0) << 0x40);
    auVar8 = vshufps_avx(auVar10,auVar10,0);
    auVar10 = ZEXT416((uint)(1.0 - auVar10._0_4_));
    auVar10 = vshufps_avx(auVar10,auVar10,0);
    (__return_storage_ptr__->bounds1).lower.field_0.m128[0] =
         auVar10._0_4_ * bupper1.lower.field_0.m128[0] +
         auVar8._0_4_ * blower0.lower.field_0.m128[0];
    (__return_storage_ptr__->bounds1).lower.field_0.m128[1] =
         auVar10._4_4_ * bupper1.lower.field_0.m128[1] +
         auVar8._4_4_ * blower0.lower.field_0.m128[1];
    (__return_storage_ptr__->bounds1).lower.field_0.m128[2] =
         auVar10._8_4_ * bupper1.lower.field_0.m128[2] +
         auVar8._8_4_ * blower0.lower.field_0.m128[2];
    (__return_storage_ptr__->bounds1).lower.field_0.m128[3] =
         auVar10._12_4_ * bupper1.lower.field_0.m128[3] +
         auVar8._12_4_ * blower0.lower.field_0.m128[3];
    (__return_storage_ptr__->bounds1).upper.field_0.m128[0] =
         auVar10._0_4_ * bupper1.upper.field_0.m128[0] +
         auVar8._0_4_ * blower0.upper.field_0.m128[0];
    (__return_storage_ptr__->bounds1).upper.field_0.m128[1] =
         auVar10._4_4_ * bupper1.upper.field_0.m128[1] +
         auVar8._4_4_ * blower0.upper.field_0.m128[1];
    (__return_storage_ptr__->bounds1).upper.field_0.m128[2] =
         auVar10._8_4_ * bupper1.upper.field_0.m128[2] +
         auVar8._8_4_ * blower0.upper.field_0.m128[2];
    (__return_storage_ptr__->bounds1).upper.field_0.m128[3] =
         auVar10._12_4_ * bupper1.upper.field_0.m128[3] +
         auVar8._12_4_ * blower0.upper.field_0.m128[3];
  }
  else {
    linearBounds::anon_class_48_6_c0a27d27::operator()(&blower1,&local_a8,(long)((int)fVar14 + 1));
    linearBounds::anon_class_48_6_c0a27d27::operator()(&bupper0,&local_a8,(long)((int)fVar13 + -1));
    auVar10 = vmaxss_avx(ZEXT416((uint)(fVar11 - fVar14)),ZEXT816(0) << 0x40);
    auVar8 = vshufps_avx(auVar10,auVar10,0);
    auVar10 = ZEXT416((uint)(1.0 - auVar10._0_4_));
    auVar2 = vshufps_avx(auVar10,auVar10,0);
    fVar19 = auVar8._0_4_ * blower1.lower.field_0.m128[0] +
             auVar2._0_4_ * blower0.lower.field_0.m128[0];
    fVar20 = auVar8._4_4_ * blower1.lower.field_0.m128[1] +
             auVar2._4_4_ * blower0.lower.field_0.m128[1];
    fVar21 = auVar8._8_4_ * blower1.lower.field_0.m128[2] +
             auVar2._8_4_ * blower0.lower.field_0.m128[2];
    fVar22 = auVar8._12_4_ * blower1.lower.field_0.m128[3] +
             auVar2._12_4_ * blower0.lower.field_0.m128[3];
    auVar10 = vmaxss_avx(ZEXT416((uint)(fVar13 - fVar12)),ZEXT816(0) << 0x40);
    auVar3 = vshufps_avx(auVar10,auVar10,0);
    auVar10 = ZEXT416((uint)(1.0 - auVar10._0_4_));
    auVar10 = vshufps_avx(auVar10,auVar10,0);
    fVar23 = auVar8._0_4_ * blower1.upper.field_0.m128[0] +
             auVar2._0_4_ * blower0.upper.field_0.m128[0];
    fVar24 = auVar8._4_4_ * blower1.upper.field_0.m128[1] +
             auVar2._4_4_ * blower0.upper.field_0.m128[1];
    fVar25 = auVar8._8_4_ * blower1.upper.field_0.m128[2] +
             auVar2._8_4_ * blower0.upper.field_0.m128[2];
    fVar26 = auVar8._12_4_ * blower1.upper.field_0.m128[3] +
             auVar2._12_4_ * blower0.upper.field_0.m128[3];
    fVar11 = auVar3._0_4_ * bupper0.lower.field_0.m128[0] +
             auVar10._0_4_ * bupper1.lower.field_0.m128[0];
    fVar12 = auVar3._4_4_ * bupper0.lower.field_0.m128[1] +
             auVar10._4_4_ * bupper1.lower.field_0.m128[1];
    fVar13 = auVar3._8_4_ * bupper0.lower.field_0.m128[2] +
             auVar10._8_4_ * bupper1.lower.field_0.m128[2];
    fVar14 = auVar3._12_4_ * bupper0.lower.field_0.m128[3] +
             auVar10._12_4_ * bupper1.lower.field_0.m128[3];
    fVar15 = auVar3._0_4_ * bupper0.upper.field_0.m128[0] +
             auVar10._0_4_ * bupper1.upper.field_0.m128[0];
    fVar16 = auVar3._4_4_ * bupper0.upper.field_0.m128[1] +
             auVar10._4_4_ * bupper1.upper.field_0.m128[1];
    fVar17 = auVar3._8_4_ * bupper0.upper.field_0.m128[2] +
             auVar10._8_4_ * bupper1.upper.field_0.m128[2];
    fVar18 = auVar3._12_4_ * bupper0.upper.field_0.m128[3] +
             auVar10._12_4_ * bupper1.upper.field_0.m128[3];
    iVar6 = -1;
    if (-1 < iVar5) {
      iVar6 = iVar5;
    }
    itime = (size_t)iVar6;
    while (itime = itime + 1, (long)itime < (long)iVar4) {
      auVar8._0_4_ = ((float)(int)itime / fVar1 - fVar9) / (fVar7 - fVar9);
      auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar10 = vshufps_avx(auVar8,auVar8,0);
      auVar8 = vshufps_avx(ZEXT416((uint)(1.0 - auVar8._0_4_)),ZEXT416((uint)(1.0 - auVar8._0_4_)),0
                          );
      linearBounds::anon_class_48_6_c0a27d27::operator()(&bi,&local_a8,itime);
      auVar2._4_4_ = fVar12 * auVar10._4_4_ + fVar20 * auVar8._4_4_;
      auVar2._0_4_ = fVar11 * auVar10._0_4_ + fVar19 * auVar8._0_4_;
      auVar2._8_4_ = fVar13 * auVar10._8_4_ + fVar21 * auVar8._8_4_;
      auVar2._12_4_ = fVar14 * auVar10._12_4_ + fVar22 * auVar8._12_4_;
      auVar2 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar2);
      auVar3._4_4_ = fVar16 * auVar10._4_4_ + fVar24 * auVar8._4_4_;
      auVar3._0_4_ = fVar15 * auVar10._0_4_ + fVar23 * auVar8._0_4_;
      auVar3._8_4_ = fVar17 * auVar10._8_4_ + fVar25 * auVar8._8_4_;
      auVar3._12_4_ = fVar18 * auVar10._12_4_ + fVar26 * auVar8._12_4_;
      auVar10 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar3);
      auVar8 = vminps_avx(auVar2,ZEXT816(0) << 0x40);
      auVar10 = vmaxps_avx(auVar10,ZEXT816(0) << 0x40);
      fVar19 = fVar19 + auVar8._0_4_;
      fVar20 = fVar20 + auVar8._4_4_;
      fVar21 = fVar21 + auVar8._8_4_;
      fVar22 = fVar22 + auVar8._12_4_;
      fVar11 = fVar11 + auVar8._0_4_;
      fVar12 = fVar12 + auVar8._4_4_;
      fVar13 = fVar13 + auVar8._8_4_;
      fVar14 = fVar14 + auVar8._12_4_;
      fVar23 = fVar23 + auVar10._0_4_;
      fVar24 = fVar24 + auVar10._4_4_;
      fVar25 = fVar25 + auVar10._8_4_;
      fVar26 = fVar26 + auVar10._12_4_;
      fVar15 = fVar15 + auVar10._0_4_;
      fVar16 = fVar16 + auVar10._4_4_;
      fVar17 = fVar17 + auVar10._8_4_;
      fVar18 = fVar18 + auVar10._12_4_;
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar19;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar20;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar21;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar22;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar23;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar24;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar25;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar26;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar11;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar12;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar13;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar14;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar15;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar16;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar17;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar18;
  }
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t primID, const BBox1f& time_range) const {
        return linearBounds(ofs,scale,r_scale0,space,primID,time_range);
      }